

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::LinearQuantizationParams::_InternalSerialize
          (LinearQuantizationParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  LogMessage *pLVar4;
  ulong uVar5;
  uint uVar6;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (0 < (this->scale_).current_size_) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar1 = (this->scale_).current_size_;
    if (stream->end_ <= puVar3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    }
    *puVar3 = '\n';
    puVar3 = puVar3 + 2;
    uVar6 = iVar1 << 2;
    for (uVar2 = uVar6; 0x7f < uVar2; uVar2 = uVar2 >> 7) {
      puVar3[-1] = (byte)uVar2 | 0x80;
      puVar3 = puVar3 + 1;
    }
    puVar3[-1] = (byte)uVar2;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,(this->scale_).arena_or_elements_,uVar6,puVar3);
  }
  if (0 < (this->bias_).current_size_) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar1 = (this->bias_).current_size_;
    if (stream->end_ <= puVar3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    }
    *puVar3 = '\x12';
    puVar3 = puVar3 + 2;
    uVar6 = iVar1 << 2;
    for (uVar2 = uVar6; 0x7f < uVar2; uVar2 = uVar2 >> 7) {
      puVar3[-1] = (byte)uVar2 | 0x80;
      puVar3 = puVar3 + 1;
    }
    puVar3[-1] = (byte)uVar2;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,(this->bias_).arena_or_elements_,uVar6,puVar3);
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    uVar5 = uVar5 & 0xfffffffffffffffc;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,*(void **)(uVar5 + 8),*(int *)(uVar5 + 0x10),target);
  }
  return target;
}

Assistant:

uint8_t* LinearQuantizationParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.LinearQuantizationParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float scale = 1;
  if (this->_internal_scale_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_scale(), target);
  }

  // repeated float bias = 2;
  if (this->_internal_bias_size() > 0) {
    target = stream->WriteFixedPacked(2, _internal_bias(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.LinearQuantizationParams)
  return target;
}